

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O2

void __thiscall XPMP2::Aircraft::SetRender(Aircraft *this,bool _bRender)

{
  list<void_*,_std::allocator<void_*>_> *this_00;
  bool bVar1;
  _List_node_base *p_Var2;
  bool bVar3;
  
  if ((this->bRender == _bRender) || (this->bRender = _bRender, _bRender)) {
    return;
  }
  bVar1 = GlobVars::IsXPThread((GlobVars *)&glob);
  bVar3 = true;
  if (bVar1) {
    (*this->_vptr_Aircraft[0xe])(this);
    ContrailRemove(this);
    this_00 = &this->listInst;
    p_Var2 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
             super__List_node_base._M_next;
    if (p_Var2 != (_List_node_base *)this_00) {
      while (p_Var2 != (_List_node_base *)this_00) {
        p_Var2 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_prev[1]._M_next;
        std::__cxx11::list<void_*,_std::allocator<void_*>_>::pop_back(this_00);
        XPLMDestroyInstance(p_Var2);
        p_Var2 = (this->listInst).super__List_base<void_*,_std::allocator<void_*>_>._M_impl._M_node.
                 super__List_node_base._M_next;
      }
      if (glob < 1) {
        bVar3 = false;
        LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/Aircraft.cpp"
               ,0x2d2,"DestroyInstances",logDEBUG,"Aircraft 0x%06X: Instance destroyed",
               (ulong)this->modeS_id);
        goto LAB_001f09cb;
      }
    }
    bVar3 = false;
  }
LAB_001f09cb:
  this->bDestroyInst = bVar3;
  return;
}

Assistant:

void Aircraft::SetRender (bool _bRender)
{
    // no change?
    if (bRender == _bRender)
        return;
    
    // Set the flag
    bRender = _bRender;
    
    // In case rendering is _now_ switched off: Remove the instance (but leave AI as is!)
    if (!bRender)
        DestroyInstances();
}